

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AssignPointsToCorners
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,
          int num_connectivity_verts)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  uint *puVar7;
  reference pvVar8;
  PointCloud *pPVar9;
  ValueType in_ESI;
  long in_RDI;
  reference rVar10;
  int c_2;
  Face face_1;
  FaceIndex f_1;
  uint32_t i_1;
  bool attribute_seam;
  CornerIndex prev_c;
  bool seam_found;
  CornerIndex act_c;
  VertexIndex vert_id_1;
  uint32_t i;
  CornerIndex deduplication_first_corner;
  CornerIndex c_1;
  int v;
  vector<int,_std::allocator<int>_> corner_to_point_map;
  vector<int,_std::allocator<int>_> point_to_corner_map;
  int32_t vert_id;
  int c;
  CornerIndex start_corner;
  Face face;
  FaceIndex f;
  MeshAttributeCornerTable *in_stack_fffffffffffffde8;
  Mesh *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  CornerIndex in_stack_fffffffffffffe00;
  CornerIndex in_stack_fffffffffffffe04;
  size_type in_stack_fffffffffffffe08;
  CornerIndex in_stack_fffffffffffffe10;
  value_type in_stack_fffffffffffffe14;
  uint in_stack_fffffffffffffe18;
  uint in_stack_fffffffffffffe1c;
  FaceIndex in_stack_fffffffffffffe24;
  bool local_1be;
  uint local_128;
  int local_124;
  ValueType local_114;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_110;
  uint local_10c;
  ThisIndexType local_108;
  uint local_104;
  uint local_100;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_fc;
  uint local_f8;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_f4;
  uint local_f0;
  byte local_e9;
  uint local_e8;
  ThisIndexType local_e4;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_e0;
  uint local_dc;
  uint local_d8;
  ThisIndexType local_d4;
  uint local_d0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_cc;
  undefined4 local_c8;
  byte local_c1;
  uint local_c0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_bc;
  uint local_b8;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_b4;
  uint local_b0;
  uint local_ac;
  reference local_a8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_98;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_94;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_90;
  uint local_8c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_38;
  uint local_34;
  int local_30;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_2c [4];
  ValueType local_1c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_18;
  ValueType local_14;
  byte local_1;
  
  local_14 = in_ESI;
  MeshDecoder::mesh(*(MeshDecoder **)(in_RDI + 8));
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x166a58);
  CornerTable::num_faces((CornerTable *)0x166a60);
  Mesh::SetNumFaces((Mesh *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10.value_),
                    in_stack_fffffffffffffe08);
  bVar1 = std::
          vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
          ::empty((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                   *)CONCAT44(in_stack_fffffffffffffe04.value_,in_stack_fffffffffffffe00.value_));
  if (bVar1) {
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_18,0);
    while( true ) {
      MeshDecoder::mesh(*(MeshDecoder **)(in_RDI + 8));
      local_1c = Mesh::num_faces((Mesh *)0x166ab5);
      bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(&local_18,&local_1c);
      if (!bVar1) break;
      std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array
                ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffe04.value_,in_stack_fffffffffffffe00.value_));
      uVar3 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_18);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(local_2c,uVar3 * 3);
      for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x166b2e);
        local_40 = local_30;
        local_3c = (uint)IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+
                                   ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                    in_stack_fffffffffffffde8,(uint *)0x166b59);
        local_38.value_ =
             (uint)CornerTable::Vertex((CornerTable *)
                                       CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                                       ,in_stack_fffffffffffffe00);
        local_44 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_38);
        local_34 = local_44;
        pvVar8 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                 operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                             *)in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(pvVar8,&local_44);
      }
      MeshDecoder::mesh(*(MeshDecoder **)(in_RDI + 8));
      local_48 = local_18.value_;
      Mesh::SetFace((Mesh *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                    in_stack_fffffffffffffe24,
                    (Face *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10.value_));
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_18);
    }
    pPVar9 = PointCloudDecoder::point_cloud(*(PointCloudDecoder **)(in_RDI + 8));
    PointCloud::set_num_points(pPVar9,local_14);
    local_1 = 1;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x166c5a);
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x166c6b)
    ;
    CornerTable::num_corners((CornerTable *)0x166c73);
    std::allocator<int>::allocator((allocator<int> *)0x166ca2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10.value_),
               in_stack_fffffffffffffe08,
               (allocator_type *)
               CONCAT44(in_stack_fffffffffffffe04.value_,in_stack_fffffffffffffe00.value_));
    std::allocator<int>::~allocator((allocator<int> *)0x166cce);
    local_8c = 0;
    while( true ) {
      uVar3 = local_8c;
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x166cf8);
      iVar2 = CornerTable::num_vertices((CornerTable *)0x166d00);
      if (iVar2 <= (int)uVar3) break;
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x166d30);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_94,local_8c);
      local_90.value_ =
           (uint)CornerTable::LeftMostCorner
                           ((CornerTable *)in_stack_fffffffffffffde8,(uint)in_stack_fffffffffffffdf0
                           );
      bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                        (&local_90,
                         (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                         &kInvalidCornerIndex);
      if (!bVar1) {
        local_98.value_ = local_90.value_;
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10.value_),
                            in_stack_fffffffffffffe08);
        local_a8 = rVar10;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
        if (bVar1) {
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_98,&local_90);
        }
        else {
          local_ac = 0;
          while( true ) {
            uVar4 = (ulong)local_ac;
            sVar5 = std::
                    vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                    ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                            *)(in_RDI + 0x1f8));
            if (sVar5 <= uVar4) break;
            std::
            vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
            ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                          *)(in_RDI + 0x1f8),(ulong)local_ac);
            local_b0 = local_90.value_;
            bVar1 = MeshAttributeCornerTable::IsCornerOnSeam
                              ((MeshAttributeCornerTable *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                               in_stack_fffffffffffffe04);
            if (bVar1) {
              std::
              vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
              ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                            *)(in_RDI + 0x1f8),(ulong)local_ac);
              local_b8 = local_90.value_;
              local_b4.value_ =
                   (uint)MeshAttributeCornerTable::Vertex
                                   (in_stack_fffffffffffffde8,(uint)in_stack_fffffffffffffdf0);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x166f99);
              local_c0 = local_90.value_;
              local_bc.value_ =
                   (uint)CornerTable::SwingRight
                                   ((CornerTable *)
                                    CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                    in_stack_fffffffffffffe00);
              local_c1 = 0;
              while( true ) {
                bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                                  (&local_bc,&local_90);
                if (!bVar1) break;
                bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                                  (&local_bc,
                                   (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                   &kInvalidCornerIndex);
                if (bVar1) {
                  local_1 = 0;
                  goto LAB_001676cf;
                }
                std::
                vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                              *)(in_RDI + 0x1f8),(ulong)local_ac);
                local_d0 = local_bc.value_;
                local_cc.value_ =
                     (uint)MeshAttributeCornerTable::Vertex
                                     (in_stack_fffffffffffffde8,(uint)in_stack_fffffffffffffdf0);
                bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator!=
                                  (&local_cc,&local_b4);
                if (bVar1) {
                  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
                            (&local_98,&local_bc);
                  local_c1 = 1;
                  break;
                }
                std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
                operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                            *)0x1670d9);
                local_d8 = local_bc.value_;
                local_d4.value_ =
                     (uint)CornerTable::SwingRight
                                     ((CornerTable *)
                                      CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                      in_stack_fffffffffffffe00);
                IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
                          (&local_bc,&local_d4);
              }
              if ((local_c1 & 1) != 0) break;
            }
            local_ac = local_ac + 1;
          }
        }
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_90,&local_98);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_60);
        uVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_90);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(ulong)uVar3);
        *pvVar6 = (value_type)sVar5;
        local_dc = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_90);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0,
                   (value_type_conflict1 *)in_stack_fffffffffffffde8);
        local_e0.value_ = local_90.value_;
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x1671f3);
        local_e8 = local_90.value_;
        local_e4.value_ =
             (uint)CornerTable::SwingRight
                             ((CornerTable *)
                              CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                              in_stack_fffffffffffffe00);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_90,&local_e4);
        while( true ) {
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                            (&local_90,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                             &kInvalidCornerIndex);
          local_1be = false;
          if (bVar1) {
            local_1be = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                                  (&local_90,&local_98);
          }
          if (local_1be == false) break;
          local_e9 = 0;
          local_f0 = 0;
          while( true ) {
            uVar4 = (ulong)local_f0;
            sVar5 = std::
                    vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                    ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                            *)(in_RDI + 0x1f8));
            if (sVar5 <= uVar4) break;
            std::
            vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
            ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                          *)(in_RDI + 0x1f8),(ulong)local_f0);
            local_f8 = local_90.value_;
            local_f4.value_ =
                 (uint)MeshAttributeCornerTable::Vertex
                                 (in_stack_fffffffffffffde8,(uint)in_stack_fffffffffffffdf0);
            std::
            vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
            ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                          *)(in_RDI + 0x1f8),(ulong)local_f0);
            local_100 = local_e0.value_;
            local_fc.value_ =
                 (uint)MeshAttributeCornerTable::Vertex
                                 (in_stack_fffffffffffffde8,(uint)in_stack_fffffffffffffdf0);
            bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator!=
                              (&local_f4,&local_fc);
            if (bVar1) {
              local_e9 = 1;
              break;
            }
            local_f0 = local_f0 + 1;
          }
          if ((local_e9 & 1) == 0) {
            in_stack_fffffffffffffe1c =
                 IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_e0);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_78,(ulong)in_stack_fffffffffffffe1c);
            in_stack_fffffffffffffe14 = *pvVar6;
            in_stack_fffffffffffffe18 =
                 IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_90);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_78,(ulong)in_stack_fffffffffffffe18);
            *pvVar6 = in_stack_fffffffffffffe14;
          }
          else {
            sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_60);
            in_stack_fffffffffffffe24.value_ = (uint)sVar5;
            uVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_90);
            puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                       (&local_78,(ulong)uVar3);
            *puVar7 = in_stack_fffffffffffffe24.value_;
            local_104 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_90);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0,
                       (value_type_conflict1 *)in_stack_fffffffffffffde8);
          }
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_e0,&local_90);
          std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                    ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                     0x1674c4);
          local_10c = local_90.value_;
          in_stack_fffffffffffffe10 =
               CornerTable::SwingRight
                         ((CornerTable *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                          in_stack_fffffffffffffe00);
          local_108.value_ = in_stack_fffffffffffffe10.value_;
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_90,&local_108);
        }
      }
      local_8c = local_8c + 1;
    }
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_110,0);
    while( true ) {
      MeshDecoder::mesh(*(MeshDecoder **)(in_RDI + 8));
      in_stack_fffffffffffffe04.value_ = Mesh::num_faces((Mesh *)0x16755b);
      local_114 = in_stack_fffffffffffffe04.value_;
      bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(&local_110,&local_114);
      in_stack_fffffffffffffe00.value_ = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe00.value_);
      if (!bVar1) break;
      std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array
                ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffe04.value_,in_stack_fffffffffffffe00.value_));
      for (local_124 = 0; local_124 < 3; local_124 = local_124 + 1) {
        uVar3 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_110);
        puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_78,(ulong)(uVar3 * 3 + local_124));
        local_128 = *puVar7;
        pvVar8 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                 operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                             *)in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(pvVar8,&local_128);
      }
      in_stack_fffffffffffffdf0 = MeshDecoder::mesh(*(MeshDecoder **)(in_RDI + 8));
      Mesh::SetFace((Mesh *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                    in_stack_fffffffffffffe24,
                    (Face *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10.value_));
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_110);
    }
    pPVar9 = PointCloudDecoder::point_cloud(*(PointCloudDecoder **)(in_RDI + 8));
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_60);
    PointCloud::set_num_points(pPVar9,(ValueType)sVar5);
    local_1 = 1;
LAB_001676cf:
    local_c8 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe04.value_,in_stack_fffffffffffffe00.value_));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe04.value_,in_stack_fffffffffffffe00.value_));
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::AssignPointsToCorners(
    int num_connectivity_verts) {
  // Map between the existing and deduplicated point ids.
  // Note that at this point we have one point id for each corner of the
  // mesh so there is corner_table_->num_corners() point ids.
  decoder_->mesh()->SetNumFaces(corner_table_->num_faces());

  if (attribute_data_.empty()) {
    // We have connectivity for position only. In this case all vertex indices
    // are equal to point indices.
    for (FaceIndex f(0); f < decoder_->mesh()->num_faces(); ++f) {
      Mesh::Face face;
      const CornerIndex start_corner(3 * f.value());
      for (int c = 0; c < 3; ++c) {
        // Get the vertex index on the corner and use it as a point index.
        const int32_t vert_id = corner_table_->Vertex(start_corner + c).value();
        face[c] = vert_id;
      }
      decoder_->mesh()->SetFace(f, face);
    }
    decoder_->point_cloud()->set_num_points(num_connectivity_verts);
    return true;
  }
  // Else we need to deduplicate multiple attributes.

  // Map between point id and an associated corner id. Only one corner for
  // each point is stored. The corners are used to sample the attribute values
  // in the last stage of the deduplication.
  std::vector<int32_t> point_to_corner_map;
  // Map between every corner and their new point ids.
  std::vector<int32_t> corner_to_point_map(corner_table_->num_corners());
  for (int v = 0; v < corner_table_->num_vertices(); ++v) {
    CornerIndex c = corner_table_->LeftMostCorner(VertexIndex(v));
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex.
    }
    CornerIndex deduplication_first_corner = c;
    if (is_vert_hole_[v]) {
      // If the vertex is on a boundary, start deduplication from the left most
      // corner that is guaranteed to lie on the boundary.
      deduplication_first_corner = c;
    } else {
      // If we are not on the boundary we need to find the first seam (of any
      // attribute).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        if (!attribute_data_[i].connectivity_data.IsCornerOnSeam(c)) {
          continue;  // No seam for this attribute, ignore it.
        }
        // Else there needs to be at least one seam edge.

        // At this point, we use identity mapping between corners and point ids.
        const VertexIndex vert_id =
            attribute_data_[i].connectivity_data.Vertex(c);
        CornerIndex act_c = corner_table_->SwingRight(c);
        bool seam_found = false;
        while (act_c != c) {
          if (act_c == kInvalidCornerIndex) {
            return false;
          }
          if (attribute_data_[i].connectivity_data.Vertex(act_c) != vert_id) {
            // Attribute seam found. Stop.
            deduplication_first_corner = act_c;
            seam_found = true;
            break;
          }
          act_c = corner_table_->SwingRight(act_c);
        }
        if (seam_found) {
          break;  // No reason to process other attributes if we found a seam.
        }
      }
    }

    // Do a deduplication pass over the corners on the processed vertex.
    // At this point each corner corresponds to one point id and our goal is to
    // merge similar points into a single point id.
    // We do a single pass in a clockwise direction over the corners and we add
    // a new point id whenever one of the attributes change.
    c = deduplication_first_corner;
    // Create a new point.
    corner_to_point_map[c.value()] =
        static_cast<uint32_t>(point_to_corner_map.size());
    point_to_corner_map.push_back(c.value());
    // Traverse in CW direction.
    CornerIndex prev_c = c;
    c = corner_table_->SwingRight(c);
    while (c != kInvalidCornerIndex && c != deduplication_first_corner) {
      bool attribute_seam = false;
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        if (attribute_data_[i].connectivity_data.Vertex(c) !=
            attribute_data_[i].connectivity_data.Vertex(prev_c)) {
          // Attribute index changed from the previous corner. We need to add a
          // new point here.
          attribute_seam = true;
          break;
        }
      }
      if (attribute_seam) {
        corner_to_point_map[c.value()] =
            static_cast<uint32_t>(point_to_corner_map.size());
        point_to_corner_map.push_back(c.value());
      } else {
        corner_to_point_map[c.value()] = corner_to_point_map[prev_c.value()];
      }
      prev_c = c;
      c = corner_table_->SwingRight(c);
    }
  }
  // Add faces.
  for (FaceIndex f(0); f < decoder_->mesh()->num_faces(); ++f) {
    Mesh::Face face;
    for (int c = 0; c < 3; ++c) {
      // Remap old points to the new ones.
      face[c] = corner_to_point_map[3 * f.value() + c];
    }
    decoder_->mesh()->SetFace(f, face);
  }
  decoder_->point_cloud()->set_num_points(
      static_cast<uint32_t>(point_to_corner_map.size()));
  return true;
}